

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes,int group)

{
  xmlRelaxNGDefinePtr pxVar1;
  int iVar2;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlRelaxNGDefinePtr_conflict pxVar4;
  xmlRelaxNGDefinePtr_conflict pxVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  
  pxVar1 = ctxt->def;
  pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
  pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
  do {
    if (nodes == (xmlNodePtr)0x0) {
      return pxVar6;
    }
    if ((((nodes->ns == (xmlNs *)0x0) || (nodes->type != XML_ELEMENT_NODE)) ||
        (iVar2 = xmlStrEqual(nodes->name,"element"), iVar2 == 0)) ||
       (iVar2 = xmlStrEqual(nodes->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
       iVar2 == 0)) {
      pxVar5 = xmlRelaxNGParsePattern(ctxt,nodes);
      pxVar4 = pxVar6;
      pxVar3 = pxVar7;
      if ((pxVar5 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
         (pxVar4 = pxVar5, pxVar3 = pxVar5, pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
        pxVar7->next = pxVar5;
        pxVar4 = pxVar6;
      }
    }
    else {
      pxVar3 = xmlRelaxNGParseElement(ctxt,nodes);
      if (pxVar3 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar4 = pxVar3;
      if (pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) {
        pxVar4 = pxVar6;
        if (((group == 1) && (pxVar6->type == XML_RELAXNG_ELEMENT)) && (pxVar6 == pxVar7)) {
          pxVar4 = xmlRelaxNGNewDefine(ctxt,nodes);
          if (pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          pxVar4->type = XML_RELAXNG_GROUP;
          pxVar4->content = pxVar7;
        }
        pxVar7->next = pxVar3;
      }
      pxVar3->parent = pxVar1;
    }
    pxVar7 = pxVar3;
    nodes = nodes->next;
    pxVar6 = pxVar4;
  } while( true );
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePatterns(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes,
                        int group)
{
    xmlRelaxNGDefinePtr def = NULL, last = NULL, cur, parent;

    parent = ctxt->def;
    while (nodes != NULL) {
        if (IS_RELAXNG(nodes, "element")) {
            cur = xmlRelaxNGParseElement(ctxt, nodes);
            if (cur == NULL)
                return (NULL);
            if (def == NULL) {
                def = last = cur;
            } else {
                if ((group == 1) && (def->type == XML_RELAXNG_ELEMENT) &&
                    (def == last)) {
                    def = xmlRelaxNGNewDefine(ctxt, nodes);
                    if (def == NULL)
                        return (NULL);
                    def->type = XML_RELAXNG_GROUP;
                    def->content = last;
                }
                last->next = cur;
                last = cur;
            }
            cur->parent = parent;
        } else {
            cur = xmlRelaxNGParsePattern(ctxt, nodes);
            if (cur != NULL) {
                if (def == NULL) {
                    def = last = cur;
                } else {
                    last->next = cur;
                    last = cur;
                }
            }
        }
        nodes = nodes->next;
    }
    return (def);
}